

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

bool utf8::internal::is_overlong_sequence<long>(uint32_t cp,long length)

{
  if (cp < 0x80) {
    if (length != 1) {
      return true;
    }
  }
  else if (cp < 0x800) {
    if (length != 2) {
      return true;
    }
  }
  else if (cp < 0x10000 && length != 3) {
    return true;
  }
  return false;
}

Assistant:

inline bool is_overlong_sequence(uint32_t cp, octet_difference_type length)
    {
        if (cp < 0x80) {
            if (length != 1) 
                return true;
        }
        else if (cp < 0x800) {
            if (length != 2) 
                return true;
        }
        else if (cp < 0x10000) {
            if (length != 3) 
                return true;
        }

        return false;
    }